

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# P2R.cpp
# Opt level: O0

void __thiscall
OpenMD::P2R::P2R(P2R *this,SimInfo *info,string *filename,string *sele1,int seleOffset,
                int seleOffset2,uint nbins)

{
  undefined1 uVar1;
  string *in_RCX;
  SimInfo *in_RDI;
  undefined4 in_R8D;
  undefined4 in_R9D;
  SelectionManager *unaff_retaddr;
  string paramString;
  stringstream params;
  undefined4 in_stack_fffffffffffffd48;
  uint in_stack_fffffffffffffd4c;
  string *in_stack_fffffffffffffd50;
  StaticAnalyser *this_00;
  SimInfo *in_stack_fffffffffffffd58;
  undefined7 in_stack_fffffffffffffd60;
  undefined1 in_stack_fffffffffffffd67;
  allocator<char> *this_01;
  SelectionEvaluator *this_02;
  string *script;
  SelectionEvaluator *in_stack_fffffffffffffda0;
  stringstream local_240 [136];
  SimInfo *in_stack_fffffffffffffe48;
  SelectionEvaluator *in_stack_fffffffffffffe50;
  string local_b8 [32];
  string local_98 [39];
  undefined1 local_71 [81];
  string *local_20;
  undefined8 info_00;
  
  local_71._73_4_ = in_R9D;
  local_71._77_4_ = in_R8D;
  local_20 = in_RCX;
  info_00 = in_RDI;
  StaticAnalyser::StaticAnalyser
            ((StaticAnalyser *)CONCAT17(in_stack_fffffffffffffd67,in_stack_fffffffffffffd60),
             in_stack_fffffffffffffd58,in_stack_fffffffffffffd50,in_stack_fffffffffffffd4c);
  *(undefined ***)&in_RDI->_vptr_SimInfo = &PTR__P2R_0055fbf8;
  *(undefined1 *)&(in_RDI->molecules_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  *(undefined1 *)((long)&(in_RDI->molecules_)._M_t._M_impl.super__Rb_tree_header._M_node_count + 1)
       = 1;
  *(undefined1 *)((long)&(in_RDI->molecules_)._M_t._M_impl.super__Rb_tree_header._M_node_count + 2)
       = 1;
  script = (string *)&in_RDI->molStampIds_;
  std::__cxx11::string::string((string *)script,local_20);
  this_01 = (allocator<char> *)
            &(in_RDI->moleculeStamps_).
             super__Vector_base<OpenMD::MoleculeStamp_*,_std::allocator<OpenMD::MoleculeStamp_*>_>.
             _M_impl.super__Vector_impl_data._M_finish;
  std::__cxx11::string::string((string *)this_01);
  this_02 = (SelectionEvaluator *)
            &(in_RDI->globalGroupMembership_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
  SelectionManager::SelectionManager(unaff_retaddr,(SimInfo *)info_00);
  SelectionManager::SelectionManager(unaff_retaddr,(SimInfo *)info_00);
  SelectionEvaluator::SelectionEvaluator(in_stack_fffffffffffffe50,in_stack_fffffffffffffe48);
  SelectionEvaluator::SelectionEvaluator(in_stack_fffffffffffffe50,in_stack_fffffffffffffe48);
  *(undefined4 *)
   &in_RDI[2].localIndexMan_.bondIndexContainer_.indexContainer_.
    super__List_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl._M_node.
    super__List_node_base._M_next = local_71._77_4_;
  *(undefined4 *)
   ((long)&in_RDI[2].localIndexMan_.bondIndexContainer_.indexContainer_.
           super__List_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
           _M_node.super__List_node_base + 4) = local_71._73_4_;
  *(undefined4 *)
   ((long)&in_RDI[2].localIndexMan_.bondIndexContainer_.indexContainer_.
           super__List_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
           _M_node.super__List_node_base + 8) = 0;
  in_RDI[2].localIndexMan_.bondIndexContainer_.indexContainer_.
  super__List_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl._M_node.
  _M_size = 0;
  in_RDI[2].localIndexMan_.bendIndexContainer_.maxIndex_ = 0;
  SelectionEvaluator::loadScriptString(in_stack_fffffffffffffda0,script);
  uVar1 = SelectionEvaluator::isDynamic
                    ((SelectionEvaluator *)
                     &(in_RDI->oneFourInteractions_).pairList_.
                      super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                      _M_finish);
  if (!(bool)uVar1) {
    in_stack_fffffffffffffd58 =
         (SimInfo *)
         &(in_RDI->globalGroupMembership_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage;
    SelectionEvaluator::evaluate(this_02);
    SelectionManager::setSelectionSet
              ((SelectionManager *)CONCAT17(uVar1,in_stack_fffffffffffffd60),
               (SelectionSet *)in_stack_fffffffffffffd58);
    SelectionSet::~SelectionSet((SelectionSet *)0x194a4f);
  }
  this_00 = (StaticAnalyser *)local_71;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_RDI,
             (char *)this_02,this_01);
  StaticAnalyser::setAnalysisType
            (this_00,(string *)CONCAT44(in_stack_fffffffffffffd4c,in_stack_fffffffffffffd48));
  std::__cxx11::string::~string((string *)(local_71 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_71);
  getPrefix((string *)in_stack_fffffffffffffd58);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffd58,(char *)this_00);
  StaticAnalyser::setOutputName
            (this_00,(string *)CONCAT44(in_stack_fffffffffffffd4c,in_stack_fffffffffffffd48));
  std::__cxx11::string::~string(local_98);
  std::__cxx11::string::~string(local_b8);
  std::__cxx11::stringstream::stringstream(local_240);
  std::__cxx11::stringstream::str();
  StaticAnalyser::setParameterString
            (this_00,(string *)CONCAT44(in_stack_fffffffffffffd4c,in_stack_fffffffffffffd48));
  std::__cxx11::string::~string((string *)&stack0xfffffffffffffda0);
  std::__cxx11::stringstream::~stringstream(local_240);
  return;
}

Assistant:

P2R::P2R(SimInfo* info, const std::string& filename, const std::string& sele1,
           int seleOffset, int seleOffset2, unsigned int nbins) :
      StaticAnalyser(info, filename, nbins),
      doVect_(false), doOffset_(true), doOffset2_(true),
      selectionScript1_(sele1), seleMan1_(info), seleMan2_(info),
      evaluator1_(info), evaluator2_(info), seleOffset_(seleOffset),
      seleOffset2_(seleOffset2) {
    evaluator1_.loadScriptString(sele1);
    if (!evaluator1_.isDynamic()) {
      seleMan1_.setSelectionSet(evaluator1_.evaluate());
    }

    setAnalysisType(
        "2nd order Legendre Polynomial Correlation using r as reference axis");
    setOutputName(getPrefix(filename) + ".P2R");
    std::stringstream params;
    const std::string paramString = params.str();
    setParameterString(paramString);
  }